

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-threadpool-cancel.c
# Opt level: O2

void timer_cb(uv_timer_t *timer)

{
  int iVar1;
  uint64_t uVar2;
  
  if (timer[-1].node.heap[1] == (void *)0x0) {
    __assert_fail("ctx->parent_handle != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/src/fs-poll.c"
                  ,0xb0,"void timer_cb(uv_timer_t *)");
  }
  if (*(undefined1 **)((long)timer[-1].node.heap[1] + 0x40) ==
      (undefined1 *)((long)&timer[-1].node + 8)) {
    uVar2 = uv_now((uv_loop_t *)timer[-1].repeat);
    timer[-1].timeout = uVar2;
    iVar1 = uv_fs_stat((uv_loop_t *)timer[-1].repeat,(uv_fs_t *)(timer + 1),(char *)&timer[6].type,
                       poll_cb);
    if (iVar1 == 0) {
      return;
    }
    abort();
  }
  __assert_fail("ctx->parent_handle->poll_ctx == ctx",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/src/fs-poll.c"
                ,0xb1,"void timer_cb(uv_timer_t *)");
}

Assistant:

static void timer_cb(uv_timer_t* handle) {
  struct cancel_info* ci;
  uv_req_t* req;
  unsigned i;

  ci = container_of(handle, struct cancel_info, timer_handle);

  for (i = 0; i < ci->nreqs; i++) {
    req = (uv_req_t*) ((char*) ci->reqs + i * ci->stride);
    ASSERT(known_broken(req) || 0 == uv_cancel(req));
  }

  uv_close((uv_handle_t*) &ci->timer_handle, NULL);
  unblock_threadpool();
  timer_cb_called++;
}